

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O3

float float16(uint16_t val)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined6 in_register_0000003a;
  
  uVar4 = (uint)CONCAT62(in_register_0000003a,val);
  fVar1 = (float)((uVar4 & 0x8000) << 0x10);
  uVar2 = (uint)(CONCAT62(in_register_0000003a,val) >> 10) & 0x1f;
  if (uVar2 == 0x1f) {
    fVar1 = (float)((uint)fVar1 | uVar4 << 0xd | 0x7f800000);
  }
  else {
    uVar3 = uVar4 & 0x3ff;
    if ((val & 0x7c00) == 0) {
      if ((val & 0x3ff) == 0) {
        return fVar1;
      }
      uVar2 = 0x1f;
      if ((val & 0x3ff) != 0) {
        for (; uVar3 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      uVar3 = uVar4 << ((char)(uVar2 ^ 0x1f) - 0x15U & 0x1f) & 0x3ff;
      uVar2 = 0x16 - (uVar2 ^ 0x1f);
    }
    fVar1 = (float)((uint)fVar1 | uVar2 * 0x800000 + uVar3 * 0x2000 + 0x38000000);
  }
  return fVar1;
}

Assistant:

static uint32_t float16i(uint16_t val)
{
	uint32_t sign = ((uint32_t)(val & 0x8000)) << 16;
	uint32_t frac = val & 0x3ff;
	int32_t  expn = (val >> 10) & 0x1f;

	if (expn == 0) {
		if (frac) {
			/* denormalized number: */
			int shift = __builtin_clz(frac) - 21;
			frac <<= shift;
			frac &= 0x3ff;
			expn = 1 - shift;
		} else {
			/* +/- zero: */
			return sign;
		}
	} else if (expn == 0x1f) {
		/* Inf/NaN: */
		return sign | 0x7f800000 | (frac << 13);
	}

	return sign | ((expn + 127 - 15) << 23) | (frac << 13);
}